

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardFile.cpp
# Opt level: O3

void __thiscall
Diligent::StandardFile::StandardFile(StandardFile *this,FileOpenAttribs *OpenAttribs)

{
  FILE *pFVar1;
  int *piVar2;
  String OpenModeStr;
  char *local_18;
  
  BasicFile::BasicFile(&this->super_BasicFile,OpenAttribs);
  (this->super_BasicFile)._vptr_BasicFile = (_func_int **)&PTR__StandardFile_00429aa0;
  this->m_pFile = (FILE *)0x0;
  BasicFile::GetOpenModeStr_abi_cxx11_(&OpenModeStr,&this->super_BasicFile);
  pFVar1 = fopen((this->super_BasicFile).m_OpenAttribs.strFilePath,OpenModeStr._M_dataplus._M_p);
  this->m_pFile = (FILE *)pFVar1;
  if (pFVar1 == (FILE *)0x0) {
    piVar2 = __errno_location();
    local_18 = strerror(*piVar2);
    LogError<true,char[21],char_const*,char[32],char*>
              (false,"StandardFile",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Platforms/Basic/src/StandardFile.cpp"
               ,0x2d,(char (*) [21])"Failed to open file ",
               &(this->super_BasicFile).m_OpenAttribs.strFilePath,
               (char (*) [32])"\nThe following error occurred: ",&local_18);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)OpenModeStr._M_dataplus._M_p != &OpenModeStr.field_2) {
    operator_delete(OpenModeStr._M_dataplus._M_p,OpenModeStr.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

StandardFile::StandardFile(const FileOpenAttribs& OpenAttribs) :
    BasicFile{OpenAttribs},
    m_pFile{nullptr}
{
#if PLATFORM_LINUX || PLATFORM_MACOS || PLATFORM_IOS || PLATFORM_TVOS || PLATFORM_WEB
    auto OpenModeStr = GetOpenModeStr();
    m_pFile          = fopen(m_OpenAttribs.strFilePath, OpenModeStr.c_str());
    if (m_pFile == nullptr)
    {
        LOG_ERROR_AND_THROW("Failed to open file ", m_OpenAttribs.strFilePath,
                            "\nThe following error occurred: ", strerror(errno));
    }
#endif
}